

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O2

int regex_match(regex_t *r,char *to_match,basic_matchlist_t *match_list)

{
  int iVar1;
  char *matched_text;
  int iVar2;
  char *__string;
  regmatch_t local_88 [11];
  
  __string = to_match;
  while( true ) {
    iVar1 = regexec((regex_t *)r,__string,10,local_88,0);
    if (iVar1 != 0) break;
    if (local_88[0].rm_so != -1) {
      iVar2 = (int)__string - (int)to_match;
      iVar1 = local_88[0].rm_so + iVar2;
      iVar2 = iVar2 + local_88[0].rm_eo;
      matched_text = strndup(to_match + iVar1,(long)(local_88[0].rm_eo - local_88[0].rm_so));
      basic_matchlist_add(match_list,iVar1,iVar2,matched_text);
    }
    __string = __string + local_88[0].rm_eo;
  }
  return iVar1;
}

Assistant:

int regex_match (regex_t * r, const char * to_match, basic_matchlist_t *match_list)
{
    const char * p = to_match;
    const int n_matches = 10;
    regmatch_t m[n_matches];

    while (1)
    {
        int i = 0;
        int nomatch = regexec (r, p, n_matches, m, 0);
        if (nomatch)
        {
            //printf ("No more matches.\n");
            return nomatch;
        }
        //printf("nomatch = %d\n", nomatch);
        for (i = 0; i < n_matches; i++)
        {
            int start;
            int finish;
            if (m[i].rm_so == -1)
            {
                break;
            }

            start = m[i].rm_so + (p - to_match);
            finish = m[i].rm_eo + (p - to_match);
            char* matched_text = strndup(to_match+start, finish-start);
            //printf("Match %d at %d, %d\n", i, m[i].rm_so, m[i].rm_eo);
            basic_matchlist_add(match_list, start, finish, matched_text);
            break;
        }

        p += m[0].rm_eo;
    }
    return 0;
}